

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void biffwrite(bifcxdef *ctx,int argc)

{
  long lVar1;
  uint uVar2;
  byte *pbVar3;
  int iVar4;
  size_t sVar5;
  long in_RDI;
  uchar buf_1 [256];
  uchar *dst;
  uchar *p;
  uint rem;
  int bin_mode;
  runsdef val;
  char buf [32];
  char typ;
  osfildef *fp;
  int in_stack_fffffffffffffe6c;
  uint in_stack_fffffffffffffe70;
  uint in_stack_fffffffffffffe74;
  int *in_stack_fffffffffffffe78;
  void *__ptr;
  dattyp typ_00;
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  byte local_178 [264];
  byte *local_70;
  byte *local_68;
  uint local_60;
  int local_5c;
  undefined8 local_58;
  void *local_50;
  undefined1 local_48 [47];
  char local_19;
  FILE *local_18;
  long local_8;
  
  local_8 = in_RDI;
  local_18 = (FILE *)bif_get_file((bifcxdef *)
                                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                  in_stack_fffffffffffffe78,
                                  (int *)CONCAT44(in_stack_fffffffffffffe74,
                                                  in_stack_fffffffffffffe70));
  typ_00 = (dattyp)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  lVar1 = *(long *)(*(long *)(local_8 + 8) + 0x20);
  *(long *)(*(long *)(local_8 + 8) + 0x20) = lVar1 + -0x10;
  local_58 = *(undefined8 *)(lVar1 + -0x10);
  local_50 = *(void **)(lVar1 + -8);
  local_19 = (char)local_58;
  if (local_5c == 0) {
    if ((char)local_58 != '\x03') {
      *(char **)(*(long *)**(undefined8 **)(local_8 + 8) + 0x18) = "fwrite";
      *(undefined4 *)(*(long *)**(undefined8 **)(local_8 + 8) + 0x68) = 1;
      runsign((runcxdef *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
              in_stack_fffffffffffffe6c);
    }
    iVar4 = osrp2(local_50);
    local_60 = iVar4 - 2;
    local_68 = (byte *)((long)local_50 + 2);
    do {
      if (local_60 == 0) goto LAB_0026d902;
      local_70 = local_178;
      while( true ) {
        uVar2 = in_stack_fffffffffffffe74 & 0xffffff;
        if (local_60 != 0) {
          uVar2 = CONCAT13((ulong)((long)local_70 - (long)local_178) < 0xff,
                           (int3)in_stack_fffffffffffffe74);
        }
        in_stack_fffffffffffffe74 = uVar2;
        if ((char)(in_stack_fffffffffffffe74 >> 0x18) == '\0') break;
        if ((*local_68 == 0x5c) && (1 < local_60)) {
          local_68 = local_68 + 1;
          local_60 = local_60 - 1;
          in_stack_fffffffffffffe70 = (uint)*local_68;
          if (in_stack_fffffffffffffe70 == 0x6e) {
            pbVar3 = local_70 + 1;
            *local_70 = 10;
            local_70 = pbVar3;
          }
          else if (in_stack_fffffffffffffe70 == 0x74) {
            pbVar3 = local_70 + 1;
            *local_70 = 9;
            local_70 = pbVar3;
          }
          else {
            pbVar3 = local_70 + 1;
            *local_70 = *local_68;
            local_70 = pbVar3;
          }
        }
        else {
          pbVar3 = local_70 + 1;
          *local_70 = *local_68;
          local_70 = pbVar3;
        }
        local_68 = local_68 + 1;
        local_60 = local_60 - 1;
      }
      *local_70 = 0;
      iVar4 = fputs((char *)local_178,local_18);
      typ_00 = (dattyp)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    } while (iVar4 != -1);
  }
  else {
    sVar5 = fwrite(&local_19,1,1,local_18);
    if (sVar5 != 1) goto LAB_0026d915;
    in_stack_fffffffffffffe84 = (int)local_19;
    if (in_stack_fffffffffffffe84 == 1) {
      oswp4s(local_48,(long)local_50);
      sVar5 = fwrite(local_48,4,1,local_18);
    }
    else {
      if (in_stack_fffffffffffffe84 != 3) {
        if (in_stack_fffffffffffffe84 != 8) {
          *(char **)(*(long *)**(undefined8 **)(local_8 + 8) + 0x18) = "fwrite";
          *(undefined4 *)(*(long *)**(undefined8 **)(local_8 + 8) + 0x68) = 1;
          runsign((runcxdef *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                  in_stack_fffffffffffffe6c);
        }
        goto LAB_0026d902;
      }
      __ptr = local_50;
      iVar4 = osrp2(local_50);
      sVar5 = fwrite(__ptr,(long)iVar4,1,local_18);
      typ_00 = (dattyp)((ulong)__ptr >> 0x20);
    }
    if (sVar5 == 1) {
LAB_0026d902:
      runpnil((runcxdef *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      return;
    }
  }
LAB_0026d915:
  local_58 = CONCAT71(local_58._1_7_,8);
  runpush((runcxdef *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),typ_00,
          (runsdef *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  return;
}

Assistant:

void biffwrite(bifcxdef *ctx, int argc)
{
    osfildef *fp;
    char      typ;
    char      buf[32];
    runsdef   val;
    int       bin_mode;
    
    /* get the file */
    bifcntargs(ctx, 2, argc);
    fp = bif_get_file(ctx, (int *)0, &bin_mode);

    /* get the value to write */
    runpop(ctx->bifcxrun, &val);
    typ = val.runstyp;

    if (bin_mode)
    {
        /* put a byte indicating the type */
        if (osfwb(fp, &typ, 1))
            goto ret_error;
        
        /* see what type of data we want to put */
        switch(typ)
        {
        case DAT_NUMBER:
            oswp4s(buf, val.runsv.runsvnum);
            if (osfwb(fp, buf, 4))
                goto ret_error;
            break;
            
        case DAT_SSTRING:
            /* write the string, including the length prefix */
            if (osfwb(fp, val.runsv.runsvstr, osrp2(val.runsv.runsvstr)))
                goto ret_error;
            break;
            
        case DAT_TRUE:
            /* all we need for this is the type prefix */
            break;
            
        default:
            /* other types are not acceptable */
            runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "fwrite");
        }
    }
    else
    {
        uint rem;
        uchar *p;
        
        switch(typ)
        {
        case DAT_SSTRING:
            /*
             *   Copy and translate the string to our buffer, in pieces if
             *   the size of the string exceeds that of our buffer.  If we
             *   encounter any escape codes, translate them.  
             */
            rem = osrp2(val.runsv.runsvstr) - 2;
            p = val.runsv.runsvstr + 2;
            while (rem > 0)
            {
                uchar *dst;
                uchar buf[256];

                /* fill up the buffer */
                for (dst = buf ;
                     rem != 0 && (size_t)(dst - buf) < sizeof(buf) - 1 ;
                     ++p, --rem)
                {
                    /* if we have an escape character, translate it */
                    if (*p == '\\' && rem > 1)
                    {
                        /* skip the opening slash */
                        ++p;
                        --rem;

                        /* translate it */
                        switch(*p)
                        {
                        case 'n':
                            *dst++ = '\n';
                            break;

                        case 't':
                            *dst++ = '\t';
                            break;

                        default:
                            *dst++ = *p;
                            break;
                        }
                    }
                    else
                    {
                        /* copy this character directly */
                        *dst++ = *p;
                    }
                }

                /* null-terminate the buffer */
                *dst = '\0';

                /* write it out */
                if (osfputs((char *)buf, fp) == EOF)
                    goto ret_error;
            }

            /* done */
            break;

        default:
            /* other types are not allowed */
            runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "fwrite");
        }
    }

    /* success */
    runpnil(ctx->bifcxrun);
    return;

ret_error:
    val.runstyp = DAT_TRUE;
    runpush(ctx->bifcxrun, DAT_TRUE, &val);
}